

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseDeclarationOrFunctionDefinition_AtDeclarator
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax *specList)

{
  DiagnosticsReporter *this_00;
  bool bVar1;
  bool bVar2;
  SyntaxKind SVar3;
  int iVar4;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar5;
  SyntaxToken *pSVar6;
  SyntaxNode *pSVar7;
  long lVar8;
  undefined4 extraout_var;
  ostream *poVar9;
  TypedefDeclarationSyntax *pTVar10;
  VariableAndOrFunctionDeclarationSyntax *pVVar11;
  IndexType IVar12;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> **ppSVar13;
  long lVar14;
  byte unaff_R13B;
  long lVar15;
  InitializerSyntax **init;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar16;
  ExtKR_ParameterDeclarationListSyntax *paramKRList;
  DeclaratorSyntax *decltor;
  DeclaratorListSyntax *decltorList;
  Backtracker BT;
  ExtKR_ParameterDeclarationListSyntax *local_b8;
  DeclaratorSyntax *local_b0;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *local_a8;
  vector<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
  *local_a0;
  Backtracker local_98;
  
  ppSVar13 = &local_a8;
  local_a8 = (DeclaratorListSyntax *)0x0;
  this_00 = &this->diagReporter_;
  local_a0 = &(this->diagReporter_).delayedDiags_;
  do {
    local_b0 = (DeclaratorSyntax *)0x0;
    bVar1 = parseDeclarator(this,&local_b0,Unspecified,Concrete);
    if (bVar1) {
      pSVar5 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                         (this,&local_b0);
      *ppSVar13 = pSVar5;
      pSVar6 = peek(this,1);
      if (pSVar6->syntaxK_ == EqualsToken) {
        pSVar7 = &SyntaxUtilities::unparenthesizeDeclarator(local_b0)->super_SyntaxNode;
        SVar3 = SyntaxNode::kind(pSVar7);
        init = (InitializerSyntax **)0x0;
        switch(SVar3) {
        case PointerDeclarator:
          lVar15 = 0x40;
          lVar14 = 0x38;
          lVar8 = 0x270;
          break;
        case IdentifierDeclarator:
          lVar15 = 0x38;
          lVar14 = 0x30;
          lVar8 = 0x280;
          break;
        default:
switchD_002c07c5_caseD_413:
          DiagnosticsReporter::UnexpectedInitializerOfDeclarator(this_00);
          unaff_R13B = ignoreDeclarator(this);
          bVar1 = false;
          goto LAB_002c0897;
        case ArrayDeclarator:
          lVar15 = 0x40;
          lVar14 = 0x38;
          lVar8 = 0x2b0;
          break;
        case FunctionDeclarator:
          iVar4 = (*(pSVar7->super_Managed)._vptr_Managed[0x56])(pSVar7);
          lVar8 = CONCAT44(extraout_var,iVar4);
          if (*(DeclaratorSyntax **)(lVar8 + 0x20) == (DeclaratorSyntax *)0x0) {
            bVar1 = true;
LAB_002c0878:
            init = (InitializerSyntax **)0x0;
          }
          else {
            pSVar7 = &SyntaxUtilities::unparenthesizeDeclarator
                                (*(DeclaratorSyntax **)(lVar8 + 0x20))->super_SyntaxNode;
            SVar3 = SyntaxNode::kind(pSVar7);
            bVar1 = SVar3 != PointerDeclarator;
            if (bVar1) goto LAB_002c0878;
            IVar12 = consume(this);
            *(IndexType *)(lVar8 + 0x38) = IVar12;
            init = (InitializerSyntax **)(lVar8 + 0x40);
          }
          if (bVar1) goto switchD_002c07c5_caseD_413;
          goto LAB_002c081f;
        }
        lVar8 = (**(code **)((long)(pSVar7->super_Managed)._vptr_Managed + lVar8))(pSVar7);
        IVar12 = consume(this);
        *(IndexType *)(lVar8 + lVar14) = IVar12;
        init = (InitializerSyntax **)(lVar15 + lVar8);
LAB_002c081f:
        bVar1 = parseInitializer(this,init);
        unaff_R13B = unaff_R13B & bVar1;
LAB_002c0897:
        if (bVar1 != false) goto LAB_002c08a3;
        bVar1 = false;
      }
      else {
        init = (InitializerSyntax **)0x0;
LAB_002c08a3:
        pSVar6 = peek(this,1);
        SVar3 = pSVar6->syntaxK_;
        if (SVar3 == OpenBraceToken) {
          bVar1 = false;
          bVar2 = parseFunctionDefinition_AtOpenBrace
                            (this,decl,specList,&local_b0,
                             (ExtKR_ParameterDeclarationListSyntax *)0x0);
          if (bVar2) {
            unaff_R13B = 1;
            goto LAB_002c0969;
          }
LAB_002c0954:
          if (init != (InitializerSyntax **)0x0) {
            DiagnosticsReporter::ExpectedFollowOfDeclaratorAndInitializer(this_00);
            goto LAB_002c0966;
          }
          Backtracker::Backtracker(&local_98,this,0);
          local_b8 = (ExtKR_ParameterDeclarationListSyntax *)0x0;
          bVar1 = parseExtKR_ParameterDeclarationList(this,&local_b8);
          if (bVar1) {
            Backtracker::discard(&local_98);
            bVar1 = parseFunctionDefinition_AtOpenBrace(this,decl,specList,&local_b0,local_b8);
            if (!bVar1) goto LAB_002c09f7;
            std::
            vector<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
            ::_M_erase_at_end(local_a0,(local_a0->
                                       super__Vector_base<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
            unaff_R13B = 1;
          }
          else {
            Backtracker::backtrack(&local_98);
            DiagnosticsReporter::ExpectedFollowOfDeclarator(this_00);
LAB_002c09f7:
            unaff_R13B = 0;
          }
          Backtracker::~Backtracker(&local_98);
        }
        else {
          if (SVar3 == CommaToken) {
            IVar12 = consume(this);
            pSVar5 = *ppSVar13;
            pSVar5->delimTkIdx_ = (uint)IVar12;
            ppSVar13 = &(pSVar5->
                        super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                        ).
                        super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                        .next;
            bVar1 = true;
            goto LAB_002c0969;
          }
          if (SVar3 != SemicolonToken) goto LAB_002c0954;
          pSVar16 = specList;
          bVar1 = specList == (SpecifierListSyntax *)0x0;
          if (specList != (SpecifierListSyntax *)0x0) {
            do {
              pSVar7 = &((pSVar16->
                         super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                         ).
                         super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        .value)->super_SyntaxNode;
              if (pSVar7 == (SyntaxNode *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"[ASSERT] at ",0xc);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                           ,100);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x143);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<empty message>",0xf);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                unaff_R13B = 0;
                break;
              }
              SVar3 = SyntaxNode::kind(pSVar7);
              if (SVar3 == TypedefStorageClass) {
                pTVar10 = makeNode<psy::C::TypedefDeclarationSyntax>(this);
                *decl = (DeclarationSyntax *)pTVar10;
                IVar12 = consume(this);
                pTVar10->semicolonTkIdx_ = IVar12;
                pTVar10->specs_ = specList;
                pTVar10->decltors_ = local_a8;
                unaff_R13B = 1;
                break;
              }
              pSVar16 = (pSVar16->
                        super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        ).
                        super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        .next;
              bVar1 = pSVar16 == (SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *)0x0;
            } while (!bVar1);
          }
          if (bVar1) {
            pVVar11 = makeNode<psy::C::VariableAndOrFunctionDeclarationSyntax>(this);
            *decl = (DeclarationSyntax *)pVVar11;
            IVar12 = consume(this);
            pVVar11->semicolonTkIdx_ = IVar12;
            pVVar11->specs_ = specList;
            pVVar11->decltors_ = local_a8;
            unaff_R13B = 1;
          }
        }
        bVar1 = false;
      }
    }
    else {
LAB_002c0966:
      bVar1 = false;
      unaff_R13B = 0;
    }
LAB_002c0969:
    if (!bVar1) {
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

bool Parser::parseDeclarationOrFunctionDefinition_AtDeclarator(
        DeclarationSyntax*& decl,
        const SpecifierListSyntax* specList)
{
    DeclaratorListSyntax* decltorList = nullptr;
    DeclaratorListSyntax** decltorList_cur = &decltorList;

    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Unspecified))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);

        InitializerSyntax** init = nullptr;
        if (peek().kind() == SyntaxKind::EqualsToken) {
            DeclaratorSyntax* unparenDecltor = const_cast<DeclaratorSyntax*>(
                    SyntaxUtilities::unparenthesizeDeclarator(decltor));
            switch (unparenDecltor->kind()) {
                case SyntaxKind::IdentifierDeclarator: {
                    auto identDecltor = unparenDecltor->asIdentifierDeclarator();
                    identDecltor->equalsTkIdx_ = consume();
                    init = &identDecltor->init_;
                    break;
                }

                case SyntaxKind::PointerDeclarator: {
                    auto ptrDecltor = unparenDecltor->asPointerDeclarator();
                    ptrDecltor->equalsTkIdx_ = consume();
                    init = &ptrDecltor->init_;
                    break;
                }

                case SyntaxKind::ArrayDeclarator: {
                    auto arrDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    arrDecltor->equalsTkIdx_ = consume();
                    init = &arrDecltor->init_;
                    break;
                }

                case SyntaxKind::FunctionDeclarator: {
                    auto funcDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    if (funcDecltor->innerDecltor_) {
                        auto unparenInnerDecltor = const_cast<DeclaratorSyntax*>(
                                    SyntaxUtilities::unparenthesizeDeclarator(funcDecltor->innerDecltor_));
                        if (unparenInnerDecltor->kind() == SyntaxKind::PointerDeclarator) {
                            funcDecltor->equalsTkIdx_ = consume();
                            init = &funcDecltor->init_;
                            break;
                        }
                    }
                    [[fallthrough]];
                }

                default:
                    diagReporter_.UnexpectedInitializerOfDeclarator();
                    return ignoreDeclarator();
            }
            if (!parseInitializer(*init))
                return false;
        }

        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                break;

            case SyntaxKind::SemicolonToken: {
                for (auto iter = specList; iter; iter = iter->next) {
                    PSY_ASSERT_2(iter->value, return false);
                    if (iter->value->kind() == SyntaxKind::TypedefStorageClass) {
                        auto tydefDecl = makeNode<TypedefDeclarationSyntax>();
                        decl = tydefDecl;
                        tydefDecl->semicolonTkIdx_ = consume();
                        tydefDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                        tydefDecl->decltors_ = decltorList;
                        return true;
                    }
                }

                auto varAndOrFuncDecl = makeNode<VariableAndOrFunctionDeclarationSyntax>();
                decl = varAndOrFuncDecl;
                varAndOrFuncDecl->semicolonTkIdx_ = consume();
                varAndOrFuncDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                varAndOrFuncDecl->decltors_ = decltorList;
                return true;
            }

            case SyntaxKind::OpenBraceToken:
                if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, nullptr))
                    return true;
                [[fallthrough]];

            default: {
                if (init) {
                    diagReporter_.ExpectedFollowOfDeclaratorAndInitializer();
                    return false;
                }

                Backtracker BT(this);
                ExtKR_ParameterDeclarationListSyntax* paramKRList = nullptr;
                if (parseExtKR_ParameterDeclarationList(paramKRList)) {
                    BT.discard();
                    if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, paramKRList)) {
                        diagReporter_.delayedDiags_.clear();
                        return true;
                    }
                    return false;
                }
                BT.backtrack();

                diagReporter_.ExpectedFollowOfDeclarator();
                return false;
            }
        }

        decltorList_cur = &(*decltorList_cur)->next;
    }
}